

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O0

void __thiscall
QPropertyBindingPrivate::notifyNonRecursive
          (QPropertyBindingPrivate *this,PendingBindingObserverList *bindingObservers)

{
  const_iterator pQVar1;
  QPropertyBindingPrivate *this_00;
  QPropertyBindingPrivate *binding;
  QPropertyBindingPrivatePtr *bindingPtr;
  const_iterator __end1;
  const_iterator __begin1;
  PendingBindingObserverList *__range1;
  QPropertyBindingPrivate *in_stack_ffffffffffffffc8;
  QVLABase<QPropertyBindingPrivatePtr> *in_stack_ffffffffffffffd0;
  QPropertyBindingPrivatePtr *local_20;
  
  notifyNonRecursive(in_stack_ffffffffffffffc8);
  local_20 = QVLABase<QPropertyBindingPrivatePtr>::begin
                       ((QVLABase<QPropertyBindingPrivatePtr> *)0x41310f);
  pQVar1 = QVLABase<QPropertyBindingPrivatePtr>::end(in_stack_ffffffffffffffd0);
  for (; local_20 != pQVar1; local_20 = local_20 + 1) {
    this_00 = (QPropertyBindingPrivate *)QPropertyBindingPrivatePtr::get(local_20);
    notifyNonRecursive(this_00);
  }
  return;
}

Assistant:

void QPropertyBindingPrivate::notifyNonRecursive(const PendingBindingObserverList &bindingObservers)
{
    notifyNonRecursive();
    for (auto &&bindingPtr: bindingObservers) {
        auto *binding = static_cast<QPropertyBindingPrivate *>(bindingPtr.get());
        binding->notifyNonRecursive();
    }
}